

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

void __thiscall GEO::Delaunay3dThread::run(Delaunay3dThread *this)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  index_t *hint;
  bool bVar4;
  
  this->finished_ = false;
  if ((this->work_begin_ == -1) || (this->work_end_ == -1)) {
    return;
  }
  this->memory_overflow_ = false;
  this->b_hint_ = 0xffffffff;
  this->e_hint_ = 0xffffffff;
  this->direction_ = true;
  uVar3 = this->work_begin_;
  uVar2 = this->work_end_;
  if ((int)uVar3 <= (int)uVar2) {
    do {
      if (this->memory_overflow_ != false) break;
      bVar4 = this->direction_ != false;
      if (bVar4) {
        uVar2 = uVar3;
      }
      hint = &this->e_hint_;
      if (bVar4) {
        hint = &this->b_hint_;
      }
      bVar4 = insert(this,this->reorder_[uVar2],hint);
      pthread_cond_broadcast((pthread_cond_t *)&this->cond_);
      if (bVar4) {
        if (this->direction_ == true) {
          this->work_begin_ = this->work_begin_ + 1;
        }
        else {
          this->work_end_ = this->work_end_ + -1;
        }
      }
      else {
        this->nb_rollbacks_ = this->nb_rollbacks_ + 1;
        if (this->interfering_thread_ != 0xff) {
          bVar1 = this->interfering_thread_ >> 1;
          this->interfering_thread_ = bVar1;
          if (*(uint *)&(this->super_Thread).super_Counted.field_0xc < (uint)bVar1) {
            wait_for_event(this,(uint)bVar1);
          }
          else {
            this->direction_ = (bool)(this->direction_ ^ 1);
          }
        }
      }
      uVar3 = this->work_begin_;
      uVar2 = this->work_end_;
    } while ((int)uVar3 <= (int)uVar2);
  }
  this->finished_ = true;
  pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  pthread_cond_broadcast((pthread_cond_t *)&this->cond_);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return;
}

Assistant:

void run() override {
            
            finished_ = false;

            if(work_begin_ == -1 || work_end_ == -1) {
                return ;
            }

            memory_overflow_ = false;

            // Current hint associated with b
            b_hint_ = NO_TETRAHEDRON;

            // Current hint associated with e
            e_hint_ = NO_TETRAHEDRON;

            // If true, insert in b->e order,
            // else insert in e->b order
            direction_ = true;
            
            while(work_end_ >= work_begin_ && !memory_overflow_) {
                index_t v = direction_ ? 
                    index_t(work_begin_) : index_t(work_end_) ;
                index_t& hint = direction_ ? b_hint_ : e_hint_;

                // Try to insert v and update hint
                bool success = insert(reorder_[v],hint);

                //   Notify all threads that are waiting for
                // this thread to release some tetrahedra.
                send_event();

                if(success) {
                    if(direction_) {
                        ++work_begin_;
                    } else {
                        --work_end_;
                    }
                } else {
                    ++nb_rollbacks_;
                    if(interfering_thread_ != NO_THREAD) {
                        interfering_thread_ = thread_index_t(
                            interfering_thread_ >> 1
                        );
                        if(id() < interfering_thread_) {
                            // If this thread has a higher priority than
                            // the one that interfered, wait for the
                            // interfering thread to release the tets that
                            // it holds (then the loop will retry to insert
                            // the same vertex).
                            wait_for_event(interfering_thread_);
                        } else {
                            // If this thread has a lower priority than
                            // the interfering thread, try inserting 
                            // from the other end of the points sequence.
                            direction_ = !direction_;
                        }
                    }
                }
            }
            finished_ = true;

	    //   Fix by Hiep Vu: wake up threads that potentially missed
	    // the previous wake ups.
	    pthread_mutex_lock(&mutex_);
	    send_event();
	    pthread_mutex_unlock(&mutex_);
        }